

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O2

void av1_init_inter_params
               (InterPredParams *inter_pred_params,int block_width,int block_height,int pix_row,
               int pix_col,int subsampling_x,int subsampling_y,int bit_depth,int use_hbd_buf,
               int is_intrabc,scale_factors *sf,buf_2d *ref_buf,int_interpfilters interp_filters)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  
  inter_pred_params->block_width = block_width;
  inter_pred_params->block_height = block_height;
  inter_pred_params->pix_row = pix_row;
  inter_pred_params->pix_col = pix_col;
  inter_pred_params->subsampling_x = subsampling_x;
  inter_pred_params->subsampling_y = subsampling_y;
  inter_pred_params->bit_depth = bit_depth;
  inter_pred_params->use_hbd_buf = use_hbd_buf;
  inter_pred_params->is_intrabc = is_intrabc;
  inter_pred_params->mode = TRANSLATION_PRED;
  inter_pred_params->comp_mode = UNIFORM_SINGLE;
  inter_pred_params->top = (0x120U >> ((byte)subsampling_y & 0x1f)) * -0x400 + 0x1000;
  inter_pred_params->left = (0x120U >> ((byte)subsampling_x & 0x1f)) * -0x400 + 0x1000;
  init_interp_filter_params
            (inter_pred_params->interp_filter_params,&interp_filters.as_filters,block_width,
             block_height,is_intrabc);
  inter_pred_params->scale_factors = sf;
  puVar1 = ref_buf->buf0;
  iVar2 = ref_buf->width;
  iVar3 = ref_buf->height;
  iVar4 = ref_buf->stride;
  uVar5 = *(undefined4 *)&ref_buf->field_0x1c;
  (inter_pred_params->ref_frame_buf).buf = ref_buf->buf;
  (inter_pred_params->ref_frame_buf).buf0 = puVar1;
  (inter_pred_params->ref_frame_buf).width = iVar2;
  (inter_pred_params->ref_frame_buf).height = iVar3;
  (inter_pred_params->ref_frame_buf).stride = iVar4;
  *(undefined4 *)&(inter_pred_params->ref_frame_buf).field_0x1c = uVar5;
  return;
}

Assistant:

static inline void av1_init_inter_params(
    InterPredParams *inter_pred_params, int block_width, int block_height,
    int pix_row, int pix_col, int subsampling_x, int subsampling_y,
    int bit_depth, int use_hbd_buf, int is_intrabc,
    const struct scale_factors *sf, const struct buf_2d *ref_buf,
    int_interpfilters interp_filters) {
  init_inter_block_params(inter_pred_params, block_width, block_height, pix_row,
                          pix_col, subsampling_x, subsampling_y, bit_depth,
                          use_hbd_buf, is_intrabc);
  init_interp_filter_params(inter_pred_params->interp_filter_params,
                            &interp_filters.as_filters, block_width,
                            block_height, is_intrabc);
  inter_pred_params->scale_factors = sf;
  inter_pred_params->ref_frame_buf = *ref_buf;
}